

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O3

void cmdline_parser_params_init(cmdline_parser_params *params)

{
  if (params != (cmdline_parser_params *)0x0) {
    params->override = 0;
    params->initialize = 1;
    params->check_required = 1;
    params->check_ambiguity = 0;
    params->print_errors = 1;
  }
  return;
}

Assistant:

void
cmdline_parser_params_init(struct cmdline_parser_params *params)
{
  if (params)
    { 
      params->override = 0;
      params->initialize = 1;
      params->check_required = 1;
      params->check_ambiguity = 0;
      params->print_errors = 1;
    }
}